

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeTree.h
# Opt level: O0

void __thiscall
ScopeData::ScopeData
          (ScopeData *this,Allocator *allocator,ScopeData *scope,uint uniqueId,
          NamespaceData *ownerNamespace)

{
  uint local_84;
  NamespaceData *ownerNamespace_local;
  uint uniqueId_local;
  ScopeData *scope_local;
  Allocator *allocator_local;
  ScopeData *this_local;
  
  this->scope = scope;
  this->uniqueId = uniqueId;
  this->type = SCOPE_NAMESPACE;
  this->ownerNamespace = ownerNamespace;
  this->ownerFunction = (FunctionData *)0x0;
  this->ownerType = (TypeBase *)0x0;
  SmallArray<TypeBase_*,_2U>::SmallArray(&this->types,allocator);
  SmallArray<FunctionData_*,_2U>::SmallArray(&this->functions,allocator);
  SmallArray<VariableData_*,_4U>::SmallArray(&this->variables,allocator);
  SmallArray<AliasData_*,_2U>::SmallArray(&this->aliases,allocator);
  SmallArray<ScopeData_*,_2U>::SmallArray(&this->scopes,allocator);
  DirectChainedMap<IdentifierLookupResult>::DirectChainedMap(&this->idLookupMap,allocator);
  DirectChainedMap<TypeLookupResult>::DirectChainedMap(&this->typeLookupMap,allocator);
  SmallArray<VariableData_*,_4U>::SmallArray(&this->allVariables,allocator);
  if (scope == (ScopeData *)0x0) {
    local_84 = 0;
  }
  else {
    local_84 = scope->scopeDepth + 1;
  }
  this->scopeDepth = local_84;
  this->breakDepth = 0;
  this->contiueDepth = 0;
  this->startOffset = 0;
  this->dataSize = 0;
  this->unrestricted = false;
  return;
}

Assistant:

ScopeData(Allocator *allocator, ScopeData *scope, unsigned uniqueId, NamespaceData *ownerNamespace): scope(scope), uniqueId(uniqueId), type(SCOPE_NAMESPACE), ownerNamespace(ownerNamespace), ownerFunction(0), ownerType(0), types(allocator), functions(allocator), variables(allocator), aliases(allocator), scopes(allocator), idLookupMap(allocator), typeLookupMap(allocator), allVariables(allocator)
	{
		scopeDepth = scope ? scope->scopeDepth + 1 : 0;
		breakDepth = 0;
		contiueDepth = 0;

		startOffset = 0;
		dataSize = 0;

		unrestricted = false;
	}